

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::push_back
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *this,
          ShapeHandle *value)

{
  size_t in_RDI;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *unaff_retaddr;
  ShapeHandle *in_stack_ffffffffffffffd8;
  polymorphic_allocator<pbrt::ShapeHandle> *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0x10) == *(long *)(in_RDI + 0x18)) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      in_stack_ffffffffffffffe0 = (polymorphic_allocator<pbrt::ShapeHandle> *)0x4;
    }
    else {
      in_stack_ffffffffffffffe0 =
           (polymorphic_allocator<pbrt::ShapeHandle> *)(*(long *)(in_RDI + 0x10) << 1);
    }
    reserve(unaff_retaddr,in_RDI);
  }
  pmr::polymorphic_allocator<pbrt::ShapeHandle>::
  construct<pbrt::ShapeHandle,pbrt::ShapeHandle_const&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(ShapeHandle *)0x4923f8);
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  return;
}

Assistant:

void push_back(const T &value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, value);
        ++nStored;
    }